

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O3

void event_signal_birthpoints(int *points,int *inc_points,wchar_t remaining)

{
  event_handler_entry *peVar1;
  game_event_data data;
  game_event_data local_40;
  
  if (event_handlers[0x2c] != (event_handler_entry *)0x0) {
    peVar1 = event_handlers[0x2c];
    local_40.string = (char *)points;
    local_40.explosion.distance_to_grid = inc_points;
    local_40.birthstage.n_choices = remaining;
    do {
      (*peVar1->fn)(EVENT_BIRTHPOINTS,&local_40,peVar1->user);
      peVar1 = peVar1->next;
    } while (peVar1 != (event_handler_entry *)0x0);
  }
  return;
}

Assistant:

void event_signal_birthpoints(const int *points, const int *inc_points,
		int remaining)
{
	game_event_data data;

	data.birthpoints.points = points;
	data.birthpoints.inc_points = inc_points;
	data.birthpoints.remaining = remaining;

	game_event_dispatch(EVENT_BIRTHPOINTS, &data);
}